

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

char_t * pugi::impl::anon_unknown_0::
         strconv_attribute_impl<pugi::impl::(anonymous_namespace)::opt_true>::parse_wnorm
                   (char_t *s,char_t end_quote)

{
  byte *pbVar1;
  byte bVar2;
  long lVar3;
  char_t *pcVar4;
  long lVar5;
  byte *s_00;
  bool bVar6;
  gap g;
  gap local_48;
  
  local_48.end = (char_t *)0x0;
  local_48.size = 0;
  if (((anonymous_namespace)::chartype_table[(byte)*s] & 8) != 0) {
    local_48.size = 0;
    do {
      lVar5 = local_48.size + 1;
      local_48.size = local_48.size + 1;
    } while (((anonymous_namespace)::chartype_table[(byte)s[lVar5]] & 8) != 0);
    s = s + local_48.size;
    local_48.end = s;
  }
  do {
    s_00 = (byte *)s;
    if (((anonymous_namespace)::chartype_table[(byte)*s] & 0xc) == 0) {
      if (((anonymous_namespace)::chartype_table[((byte *)s)[1]] & 0xc) != 0) {
        s_00 = (byte *)s + 1;
        goto LAB_0012f5c7;
      }
      if (((anonymous_namespace)::chartype_table[((byte *)s)[2]] & 0xc) != 0) {
        s_00 = (byte *)s + 2;
        goto LAB_0012f5c7;
      }
      bVar6 = ((anonymous_namespace)::chartype_table[((byte *)s)[3]] & 0xc) == 0;
      s_00 = (byte *)s + 4;
      if (!bVar6) {
        s_00 = (byte *)s + 3;
      }
    }
    else {
LAB_0012f5c7:
      bVar6 = false;
    }
    s = (char_t *)s_00;
    if (!bVar6) {
      bVar2 = *s_00;
      if (bVar2 == end_quote) {
        pcVar4 = gap::flush(&local_48,(char_t *)s_00);
        do {
          *pcVar4 = '\0';
          pbVar1 = (byte *)(pcVar4 + -1);
          pcVar4 = pcVar4 + -1;
        } while (((anonymous_namespace)::chartype_table[*pbVar1] & 8) != 0);
        return (char_t *)(s_00 + 1);
      }
      if (((anonymous_namespace)::chartype_table[bVar2] & 8) == 0) {
        if ((ulong)bVar2 == 0x26) {
          s = strconv_escape((char_t *)s_00,&local_48);
        }
        else {
          if (bVar2 == 0) {
            return (char_t *)0x0;
          }
          s = (char_t *)(s_00 + 1);
        }
      }
      else {
        s = (char_t *)(s_00 + 1);
        *s_00 = 0x20;
        if (((anonymous_namespace)::chartype_table[s_00[1]] & 8) != 0) {
          lVar5 = 0;
          do {
            lVar3 = lVar5 + 2;
            lVar5 = lVar5 + 1;
          } while (((anonymous_namespace)::chartype_table[s_00[lVar3]] & 8) != 0);
          if ((byte *)local_48.end != (byte *)0x0) {
            if (s < local_48.end) {
              __assert_fail("s >= end",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/JeffIrwin[P]maph/submodules/colormapper/submodules/pugixml/src/pugixml.cpp"
                            ,0x974,
                            "void pugi::impl::(anonymous namespace)::gap::push(char_t *&, size_t)");
            }
            memmove(local_48.end + -local_48.size,local_48.end,(long)s - (long)local_48.end);
          }
          s = (char_t *)((byte *)s + lVar5);
          local_48.size = local_48.size + lVar5;
          local_48.end = s;
        }
      }
    }
  } while( true );
}

Assistant:

static char_t* parse_wnorm(char_t* s, char_t end_quote)
		{
			gap g;

			// trim leading whitespaces
			if (PUGI__IS_CHARTYPE(*s, ct_space))
			{
				char_t* str = s;

				do ++str;
				while (PUGI__IS_CHARTYPE(*str, ct_space));

				g.push(s, str - s);
			}

			while (true)
			{
				PUGI__SCANWHILE_UNROLL(!PUGI__IS_CHARTYPE(ss, ct_parse_attr_ws | ct_space));

				if (*s == end_quote)
				{
					char_t* str = g.flush(s);

					do *str-- = 0;
					while (PUGI__IS_CHARTYPE(*str, ct_space));

					return s + 1;
				}
				else if (PUGI__IS_CHARTYPE(*s, ct_space))
				{
					*s++ = ' ';

					if (PUGI__IS_CHARTYPE(*s, ct_space))
					{
						char_t* str = s + 1;
						while (PUGI__IS_CHARTYPE(*str, ct_space)) ++str;

						g.push(s, str - s);
					}
				}
				else if (opt_escape::value && *s == '&')
				{
					s = strconv_escape(s, g);
				}
				else if (!*s)
				{
					return 0;
				}
				else ++s;
			}
		}